

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O3

idx_t __thiscall
duckdb::WindowTokenTree::Rank(WindowTokenTree *this,idx_t lower,idx_t upper,idx_t row_idx)

{
  uint uVar1;
  value_type vVar2;
  bool bVar3;
  type this_00;
  const_reference pvVar4;
  const_reference pvVar5;
  type this_01;
  const_reference pvVar6;
  const_reference pvVar7;
  unsigned_long uVar8;
  vector<unsigned_long,_true> *this_02;
  ulong uVar9;
  vector<unsigned_int,_true> *this_03;
  unsigned_long uVar10;
  pointer puVar11;
  pointer puVar12;
  ulong uVar13;
  idx_t run_begin;
  size_type sVar14;
  size_type sVar15;
  ulong *puVar16;
  ulong *puVar17;
  uint *puVar18;
  uint *puVar19;
  unsigned_long run_begin_1;
  size_type __n;
  idx_t run_begin_2;
  idx_t val;
  idx_t iVar20;
  ulong uVar21;
  idx_t iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  idx_t local_98;
  ulong local_90;
  size_type local_88;
  idx_t local_80;
  size_type local_60;
  size_type local_58;
  
  if ((this->super_WindowMergeSortTree).mst64.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *)0x0) {
    this_01 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
              ::operator*(&(this->super_WindowMergeSortTree).mst32);
    pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
             ::operator[](&this_01->tree,0);
    pvVar7 = vector<unsigned_int,_true>::operator[](&pvVar6->first,row_idx);
    iVar22 = 1;
    if (lower < upper) {
      uVar1 = *pvVar7;
      if (upper - 1 == lower) {
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this_01->tree,0);
        puVar12 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar22 = 1;
        local_80 = lower;
      }
      else {
        local_88 = 1;
        sVar15 = 0;
        uVar25 = upper - 1;
        iVar20 = lower;
        do {
          uVar23 = uVar25;
          iVar20 = iVar20 >> 5;
          local_88 = local_88 * 0x20;
          sVar15 = sVar15 + 1;
          uVar25 = uVar23 >> 5;
        } while (iVar20 != uVar23 >> 5);
        local_80 = local_88 * uVar23 >> 5;
        iVar22 = 1;
        local_98 = local_80;
        if (2 < sVar15) {
          uVar9 = iVar20 * local_88;
          pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,0);
          uVar25 = (long)(pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          if (uVar9 + local_88 <= uVar25) {
            uVar25 = uVar9 + local_88;
          }
          pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,sVar15);
          puVar12 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar19 = puVar12 + uVar9;
          uVar21 = uVar25 - uVar9;
          if (uVar21 != 0 && (long)uVar9 <= (long)uVar25) {
            do {
              uVar25 = uVar21 >> 1;
              uVar24 = ~uVar25 + uVar21;
              uVar21 = uVar25;
              if (puVar19[uVar25] < uVar1) {
                puVar19 = puVar19 + uVar25 + 1;
                uVar21 = uVar24;
              }
            } while (0 < (long)uVar21);
          }
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar19 - (long)puVar12 >> 2);
          uVar25 = (uVar9 / local_88) * 0x40 + (uVar8 & 0xffffffffffffffe0);
          local_60 = (uVar23 | 0xffffffffffffffe0) + uVar25;
          local_58 = (uint)uVar23 & 0x1f | uVar25;
          iVar22 = 1;
          uVar25 = sVar15;
          do {
            sVar15 = uVar25 - 1;
            local_88 = local_88 >> 5;
            pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                     ::operator[](&this_01->tree,sVar15);
            puVar12 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                     ::operator[](&this_01->tree,uVar25);
            this_03 = &pvVar6->second;
            local_60 = local_60 + 0x1f;
            uVar23 = local_98 - lower;
            while (local_88 <= uVar23) {
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_60);
              uVar9 = (ulong)*pvVar7;
              puVar19 = puVar12 + uVar9;
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_60 + 0x20);
              uVar23 = *pvVar7 - uVar9;
              if (uVar23 != 0 && uVar9 <= *pvVar7) {
                do {
                  uVar9 = uVar23 >> 1;
                  uVar21 = ~uVar9 + uVar23;
                  uVar23 = uVar9;
                  if (puVar19[uVar9] < uVar1) {
                    puVar19 = puVar19 + uVar9 + 1;
                    uVar23 = uVar21;
                  }
                } while (0 < (long)uVar23);
              }
              local_98 = local_98 - local_88;
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar19 - (long)puVar12 >> 2);
              iVar22 = iVar22 + (uVar8 - local_98);
              local_60 = local_60 - 1;
              uVar23 = local_98 - lower;
            }
            if (local_98 != lower) {
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_60);
              uVar9 = (ulong)*pvVar7;
              puVar19 = puVar12 + uVar9;
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_60 + 0x20);
              uVar23 = *pvVar7 - uVar9;
              if (uVar23 != 0 && uVar9 <= *pvVar7) {
                do {
                  uVar9 = uVar23 >> 1;
                  uVar21 = ~uVar9 + uVar23;
                  uVar23 = uVar9;
                  if (puVar19[uVar9] < uVar1) {
                    puVar19 = puVar19 + uVar9 + 1;
                    uVar23 = uVar21;
                  }
                } while (0 < (long)uVar23);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar19 - (long)puVar12 >> 2);
              local_60 = (lower / local_88) * 0x40 + (uVar8 & 0xffffffffffffffe0);
            }
            for (; local_88 <= upper - local_80; local_80 = local_80 + local_88) {
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_58);
              uVar9 = (ulong)*pvVar7;
              puVar19 = puVar12 + uVar9;
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_58 + 0x20);
              uVar23 = *pvVar7 - uVar9;
              if (uVar23 != 0 && uVar9 <= *pvVar7) {
                do {
                  uVar9 = uVar23 >> 1;
                  uVar21 = ~uVar9 + uVar23;
                  uVar23 = uVar9;
                  if (puVar19[uVar9] < uVar1) {
                    puVar19 = puVar19 + uVar9 + 1;
                    uVar23 = uVar21;
                  }
                } while (0 < (long)uVar23);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar19 - (long)puVar12 >> 2);
              iVar22 = iVar22 + (uVar8 - local_80);
              local_58 = local_58 + 1;
            }
            if (local_80 != upper) {
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_58);
              uVar9 = (ulong)*pvVar7;
              puVar19 = puVar12 + uVar9;
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_58 + 0x20);
              uVar23 = *pvVar7 - uVar9;
              if (uVar23 != 0 && uVar9 <= *pvVar7) {
                do {
                  uVar9 = uVar23 >> 1;
                  uVar21 = ~uVar9 + uVar23;
                  uVar23 = uVar9;
                  if (puVar19[uVar9] < uVar1) {
                    puVar19 = puVar19 + uVar9 + 1;
                    uVar23 = uVar21;
                  }
                } while (0 < (long)uVar23);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar19 - (long)puVar12 >> 2);
              local_58 = (upper / local_88) * 0x40 + (uVar8 & 0xffffffffffffffe0);
            }
            bVar3 = 2 < uVar25;
            uVar25 = sVar15;
          } while (bVar3);
        }
        if (1 < sVar15) {
          sVar15 = sVar15 - 1;
          do {
            uVar23 = local_88 >> 5;
            pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                     ::operator[](&this_01->tree,sVar15);
            puVar12 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar25 = local_98 - lower;
            while (uVar23 <= uVar25) {
              puVar19 = puVar12 + (local_98 - uVar23);
              uVar25 = uVar23;
              puVar18 = puVar19;
              if (0x1f < local_88) {
                do {
                  uVar9 = uVar25 >> 1;
                  if (puVar18[uVar9] < uVar1) {
                    puVar18 = puVar18 + uVar9 + 1;
                    uVar9 = ~uVar9 + uVar25;
                  }
                  uVar25 = uVar9;
                } while (0 < (long)uVar9);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar18 - (long)puVar12 >> 2);
              uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar19 - (long)puVar12 >> 2);
              iVar22 = iVar22 + (uVar8 - uVar10);
              local_98 = local_98 - uVar23;
              uVar25 = local_98 - lower;
            }
            for (; uVar23 <= upper - local_80; local_80 = local_80 + uVar23) {
              puVar19 = puVar12 + local_80;
              uVar25 = uVar23;
              do {
                uVar9 = uVar25 >> 1;
                uVar21 = ~uVar9 + uVar25;
                uVar25 = uVar9;
                if (puVar19[uVar9] < uVar1) {
                  puVar19 = puVar19 + uVar9 + 1;
                  uVar25 = uVar21;
                }
              } while (0 < (long)uVar25);
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar19 - (long)puVar12 >> 2);
              uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(local_80);
              iVar22 = iVar22 + (uVar8 - uVar10);
            }
            sVar15 = sVar15 - 1;
            local_88 = uVar23;
          } while (sVar15 != 0);
        }
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this_01->tree,0);
        puVar12 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_98 != lower) {
          do {
            iVar22 = iVar22 + (puVar12[lower] < uVar1);
            lower = lower + 1;
          } while (local_98 != lower);
        }
      }
      for (; local_80 != upper; local_80 = local_80 + 1) {
        iVar22 = iVar22 + (puVar12[local_80] < uVar1);
      }
    }
  }
  else {
    this_00 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
              ::operator*(&(this->super_WindowMergeSortTree).mst64);
    pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[](&this_00->tree,0);
    pvVar5 = vector<unsigned_long,_true>::operator[](&pvVar4->first,row_idx);
    iVar22 = 1;
    if (lower < upper) {
      uVar25 = *pvVar5;
      if (upper - 1 == lower) {
        pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this_00->tree,0);
        puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar22 = 1;
        val = lower;
      }
      else {
        local_90 = 1;
        sVar14 = 0;
        uVar23 = upper - 1;
        iVar20 = lower;
        do {
          uVar9 = uVar23;
          iVar20 = iVar20 >> 5;
          local_90 = local_90 * 0x20;
          sVar14 = sVar14 + 1;
          uVar23 = uVar9 >> 5;
        } while (iVar20 != uVar9 >> 5);
        val = local_90 * uVar9 >> 5;
        iVar22 = 1;
        local_98 = val;
        if (2 < sVar14) {
          uVar21 = iVar20 * local_90;
          pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,0);
          uVar23 = (long)(pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                         .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                         .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          if (uVar21 + local_90 <= uVar23) {
            uVar23 = uVar21 + local_90;
          }
          pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,sVar14);
          puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar17 = puVar11 + uVar21;
          uVar24 = uVar23 - uVar21;
          if (uVar24 != 0 && (long)uVar21 <= (long)uVar23) {
            do {
              uVar23 = uVar24 >> 1;
              uVar13 = ~uVar23 + uVar24;
              uVar24 = uVar23;
              if (puVar17[uVar23] < uVar25) {
                puVar17 = puVar17 + uVar23 + 1;
                uVar24 = uVar13;
              }
            } while (0 < (long)uVar24);
          }
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar17 - (long)puVar11 >> 3);
          uVar23 = (uVar21 / local_90) * 0x40 + (uVar8 & 0xffffffffffffffe0);
          local_88 = (uVar9 | 0xffffffffffffffe0) + uVar23;
          __n = (uint)uVar9 & 0x1f | uVar23;
          iVar22 = 1;
          uVar23 = sVar14;
          do {
            sVar14 = uVar23 - 1;
            local_90 = local_90 >> 5;
            pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                     ::operator[](&this_00->tree,sVar14);
            puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                     ::operator[](&this_00->tree,uVar23);
            this_02 = &pvVar4->second;
            local_88 = local_88 + 0x1f;
            uVar9 = local_98 - lower;
            while (local_90 <= uVar9) {
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,local_88);
              vVar2 = *pvVar5;
              puVar17 = puVar11 + vVar2;
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,local_88 + 0x20);
              uVar9 = *pvVar5 - vVar2;
              if (uVar9 != 0 && (long)vVar2 <= (long)*pvVar5) {
                do {
                  uVar21 = uVar9 >> 1;
                  uVar24 = ~uVar21 + uVar9;
                  uVar9 = uVar21;
                  if (puVar17[uVar21] < uVar25) {
                    puVar17 = puVar17 + uVar21 + 1;
                    uVar9 = uVar24;
                  }
                } while (0 < (long)uVar9);
              }
              local_98 = local_98 - local_90;
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar17 - (long)puVar11 >> 3);
              iVar22 = iVar22 + (uVar8 - local_98);
              local_88 = local_88 - 1;
              uVar9 = local_98 - lower;
            }
            if (local_98 != lower) {
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,local_88);
              vVar2 = *pvVar5;
              puVar17 = puVar11 + vVar2;
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,local_88 + 0x20);
              uVar9 = *pvVar5 - vVar2;
              if (uVar9 != 0 && (long)vVar2 <= (long)*pvVar5) {
                do {
                  uVar21 = uVar9 >> 1;
                  uVar24 = ~uVar21 + uVar9;
                  uVar9 = uVar21;
                  if (puVar17[uVar21] < uVar25) {
                    puVar17 = puVar17 + uVar21 + 1;
                    uVar9 = uVar24;
                  }
                } while (0 < (long)uVar9);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar17 - (long)puVar11 >> 3);
              local_88 = (lower / local_90) * 0x40 + (uVar8 & 0xffffffffffffffe0);
            }
            for (; local_90 <= upper - val; val = val + local_90) {
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,__n);
              vVar2 = *pvVar5;
              puVar17 = puVar11 + vVar2;
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,__n + 0x20);
              uVar9 = *pvVar5 - vVar2;
              if (uVar9 != 0 && (long)vVar2 <= (long)*pvVar5) {
                do {
                  uVar21 = uVar9 >> 1;
                  uVar24 = ~uVar21 + uVar9;
                  uVar9 = uVar21;
                  if (puVar17[uVar21] < uVar25) {
                    puVar17 = puVar17 + uVar21 + 1;
                    uVar9 = uVar24;
                  }
                } while (0 < (long)uVar9);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar17 - (long)puVar11 >> 3);
              iVar22 = iVar22 + (uVar8 - val);
              __n = __n + 1;
            }
            if (val != upper) {
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,__n);
              vVar2 = *pvVar5;
              puVar17 = puVar11 + vVar2;
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,__n + 0x20);
              uVar9 = *pvVar5 - vVar2;
              if (uVar9 != 0 && (long)vVar2 <= (long)*pvVar5) {
                do {
                  uVar21 = uVar9 >> 1;
                  uVar24 = ~uVar21 + uVar9;
                  uVar9 = uVar21;
                  if (puVar17[uVar21] < uVar25) {
                    puVar17 = puVar17 + uVar21 + 1;
                    uVar9 = uVar24;
                  }
                } while (0 < (long)uVar9);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar17 - (long)puVar11 >> 3);
              __n = (upper / local_90) * 0x40 + (uVar8 & 0xffffffffffffffe0);
            }
            bVar3 = 2 < uVar23;
            uVar23 = sVar14;
          } while (bVar3);
        }
        if (1 < sVar14) {
          sVar14 = sVar14 - 1;
          do {
            uVar9 = local_90 >> 5;
            pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                     ::operator[](&this_00->tree,sVar14);
            puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar23 = local_98 - lower;
            while (uVar9 <= uVar23) {
              puVar17 = puVar11 + (local_98 - uVar9);
              uVar23 = uVar9;
              puVar16 = puVar17;
              if (0x1f < local_90) {
                do {
                  uVar21 = uVar23 >> 1;
                  if (puVar16[uVar21] < uVar25) {
                    puVar16 = puVar16 + uVar21 + 1;
                    uVar21 = ~uVar21 + uVar23;
                  }
                  uVar23 = uVar21;
                } while (0 < (long)uVar21);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar16 - (long)puVar11 >> 3);
              uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar17 - (long)puVar11 >> 3);
              iVar22 = iVar22 + (uVar8 - uVar10);
              local_98 = local_98 - uVar9;
              uVar23 = local_98 - lower;
            }
            for (; uVar9 <= upper - val; val = val + uVar9) {
              puVar17 = puVar11 + val;
              uVar23 = uVar9;
              do {
                uVar21 = uVar23 >> 1;
                uVar24 = ~uVar21 + uVar23;
                uVar23 = uVar21;
                if (puVar17[uVar21] < uVar25) {
                  puVar17 = puVar17 + uVar21 + 1;
                  uVar23 = uVar24;
                }
              } while (0 < (long)uVar23);
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar17 - (long)puVar11 >> 3);
              uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(val);
              iVar22 = iVar22 + (uVar8 - uVar10);
            }
            sVar14 = sVar14 - 1;
            local_90 = uVar9;
          } while (sVar14 != 0);
        }
        pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this_00->tree,0);
        puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_98 != lower) {
          do {
            iVar22 = iVar22 + (puVar11[lower] < uVar25);
            lower = lower + 1;
          } while (local_98 != lower);
        }
      }
      for (; val != upper; val = val + 1) {
        iVar22 = iVar22 + (*(ulong *)((long)puVar11 + val * 8) < uVar25);
      }
    }
  }
  return iVar22;
}

Assistant:

idx_t WindowTokenTree::Rank(const idx_t lower, const idx_t upper, const idx_t row_idx) const {
	if (mst64) {
		return TokenRank(*mst64, lower, upper, row_idx);
	} else {
		return TokenRank(*mst32, lower, upper, row_idx);
	}
}